

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  byte bVar1;
  tdefl_sym_freq *A;
  tdefl_sym_freq local_a68;
  mz_uint code_size;
  mz_uint code;
  mz_uint rev_code;
  mz_uint16 *pSym_count;
  int num_used_syms;
  tdefl_sym_freq *pSyms;
  tdefl_sym_freq syms1 [288];
  tdefl_sym_freq syms0 [288];
  mz_uint next_code [33];
  int local_b8 [2];
  int num_codes [33];
  uint local_2c;
  tdefl_sym_freq local_28;
  int l;
  int j;
  int i;
  int static_table_local;
  int code_size_limit_local;
  int table_len_local;
  int table_num_local;
  tdefl_compressor *d_local;
  
  memset(local_b8,0,0x84);
  if (static_table == 0) {
    pSym_count._4_4_ = 0;
    for (l = 0; l < table_len; l = l + 1) {
      if (d->m_huff_count[table_num][l] != 0) {
        syms1[(long)(int)pSym_count._4_4_ + 0x11e].m_key = d->m_huff_count[table_num][l];
        syms1[(long)(int)pSym_count._4_4_ + 0x11e].m_sym_index = (mz_uint16)l;
        pSym_count._4_4_ = pSym_count._4_4_ + 1;
      }
    }
    A = tdefl_radix_sort_syms(pSym_count._4_4_,syms1 + 0x11e,(tdefl_sym_freq *)&pSyms);
    tdefl_calculate_minimum_redundancy(A,pSym_count._4_4_);
    for (l = 0; l < (int)pSym_count._4_4_; l = l + 1) {
      local_b8[A[l].m_key] = local_b8[A[l].m_key] + 1;
    }
    tdefl_huffman_enforce_max_code_size(local_b8,pSym_count._4_4_,code_size_limit);
    memset(d->m_huff_code_sizes + table_num,0,0x120);
    memset(d->m_huff_codes + table_num,0,0x240);
    local_28.m_key = pSym_count._4_2_;
    local_28.m_sym_index = pSym_count._6_2_;
    for (l = 1; l <= code_size_limit; l = l + 1) {
      for (local_2c = local_b8[l]; 0 < (int)local_2c; local_2c = local_2c + -1) {
        local_28 = (tdefl_sym_freq)((int)local_28 - 1);
        d->m_huff_code_sizes[table_num][A[(int)local_28].m_sym_index] = (mz_uint8)l;
      }
    }
  }
  else {
    for (l = 0; l < table_len; l = l + 1) {
      bVar1 = d->m_huff_code_sizes[table_num][l];
      local_b8[bVar1] = local_b8[bVar1] + 1;
    }
  }
  syms0[0x11f].m_key = 0;
  syms0[0x11f].m_sym_index = 0;
  local_28.m_key = 0;
  local_28.m_sym_index = 0;
  for (l = 2; l <= code_size_limit; l = l + 1) {
    local_28 = (tdefl_sym_freq)(((int)local_28 + local_b8[l + -1]) * 2);
    syms0[(long)l + 0x11e] = local_28;
  }
  for (l = 0; l < table_len; l = l + 1) {
    code_size = 0;
    local_2c = (uint)d->m_huff_code_sizes[table_num][l];
    if (local_2c != 0) {
      local_a68 = syms0[(ulong)local_2c + 0x11e];
      syms0[(ulong)local_2c + 0x11e] = (tdefl_sym_freq)((int)local_a68 + 1);
      for (; 0 < (int)local_2c; local_2c = local_2c - 1) {
        code_size = code_size << 1 | (uint)local_a68 & 1;
        local_a68 = (tdefl_sym_freq)((uint)local_a68 >> 1);
      }
      d->m_huff_codes[table_num][l] = (mz_uint16)code_size;
    }
  }
  return;
}

Assistant:

static void tdefl_optimize_huffman_table(tdefl_compressor *d, int table_num,
                                         int table_len, int code_size_limit,
                                         int static_table) {
  int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
  mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
  MZ_CLEAR_ARR(num_codes);
  if (static_table) {
    for (i = 0; i < table_len; i++)
      num_codes[d->m_huff_code_sizes[table_num][i]]++;
  } else {
    tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS],
        *pSyms;
    int num_used_syms = 0;
    const mz_uint16 *pSym_count = &d->m_huff_count[table_num][0];
    for (i = 0; i < table_len; i++)
      if (pSym_count[i]) {
        syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
        syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
      }

    pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
    tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

    for (i = 0; i < num_used_syms; i++)
      num_codes[pSyms[i].m_key]++;

    tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms,
                                        code_size_limit);

    MZ_CLEAR_ARR(d->m_huff_code_sizes[table_num]);
    MZ_CLEAR_ARR(d->m_huff_codes[table_num]);
    for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
      for (l = num_codes[i]; l > 0; l--)
        d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
  }

  next_code[1] = 0;
  for (j = 0, i = 2; i <= code_size_limit; i++)
    next_code[i] = j = ((j + num_codes[i - 1]) << 1);

  for (i = 0; i < table_len; i++) {
    mz_uint rev_code = 0, code, code_size;
    if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
      continue;
    code = next_code[code_size]++;
    for (l = code_size; l > 0; l--, code >>= 1)
      rev_code = (rev_code << 1) | (code & 1);
    d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
  }
}